

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::PolarB::define(PolarB *this,FabArrayBase *fa)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Long LVar6;
  int *piVar7;
  IntVect *pIVar8;
  Box *pBVar9;
  size_type sVar10;
  reference pvVar11;
  FabArrayBase *in_RSI;
  long in_RDI;
  Box *this_00;
  IntVect IVar12;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *cctv;
  pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  *kv;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *__range2;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *Tags;
  int ipass;
  CopyComTag cct;
  int src_owner;
  Box bxrcv_1;
  Box bxsnd_1;
  int ksnd_1;
  int M_1;
  int j_1;
  Box src_box_1;
  Box dst_box_1;
  int n_1;
  Box result_3;
  Box *gbx_1;
  int krcv_1;
  int i_1;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *recv_tags;
  Box bxsnd;
  int dst_owner;
  Box *bxrcv;
  int krcv;
  int M;
  int j;
  Box dst_box;
  Box src_box;
  int n;
  Box gbx;
  int ksnd;
  int i;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *send_tags;
  Array<Box,_8> domain_src;
  PolarFn2 convert_corner;
  PolarFn convert;
  Array<Box,_8> domain_dst;
  Box loxy_corner;
  Box hix_box;
  Box lox_box;
  int ymid;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  int nlocal;
  Vector<int,_std::allocator<int>_> *imap;
  DistributionMapping *dm;
  BoxArray *ba;
  int myproc;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int bg;
  uint bitval;
  IntVect hi_1;
  IntVect low_1;
  value_type *in_stack_fffffffffffff6e8;
  value_type *in_stack_fffffffffffff6f0;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  in_stack_fffffffffffff6f8;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  CopyComTag *in_stack_fffffffffffff720;
  Box *in_stack_fffffffffffff728;
  int in_stack_fffffffffffff730;
  int in_stack_fffffffffffff734;
  undefined4 in_stack_fffffffffffff790;
  _Self local_7b8;
  _Self local_7b0;
  value_type *local_7a8;
  value_type *local_7a0;
  int local_798;
  CopyComTag local_794;
  int local_754;
  Box local_750;
  Box local_734;
  int local_718;
  int local_714;
  int local_710;
  Box local_6f0;
  int local_6d4;
  undefined1 local_6d0 [28];
  Box local_6b4;
  Box *local_698;
  int local_690;
  int local_68c;
  type local_688;
  CopyComTag local_680;
  Box local_640;
  int local_624;
  Box *local_620;
  int local_618;
  int local_614;
  int local_610;
  Box local_5f0;
  int local_5d4;
  Box local_5d0;
  int local_5b4;
  int local_5b0;
  type local_5a0;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  IntVect local_4a4;
  Box local_498;
  Box local_478;
  Box local_458;
  Box local_438;
  undefined8 local_418;
  undefined4 uStack_410;
  undefined4 local_40c;
  undefined4 uStack_408;
  undefined8 uStack_404;
  undefined8 uStack_3fc;
  undefined4 uStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined4 uStack_3d8;
  undefined4 local_3d4;
  undefined4 uStack_3d0;
  undefined8 uStack_3cc;
  undefined8 uStack_3c4;
  undefined4 uStack_3bc;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  Box local_38c;
  Box local_370;
  Box local_354;
  IntVect local_338;
  IntVect local_32c;
  undefined8 local_320 [3];
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  int in_stack_fffffffffffffd04;
  int in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  Box *in_stack_fffffffffffffd10;
  BoxArray *in_stack_fffffffffffffd18;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_2c8;
  int local_2ac;
  Vector<int,_std::allocator<int>_> *local_2a8;
  DistributionMapping *local_2a0;
  BoxArray *local_298;
  int local_28c;
  FabArrayBase *local_288;
  undefined4 local_274;
  long local_270;
  undefined4 local_264;
  long local_260;
  undefined4 local_254;
  long local_250;
  undefined4 local_244;
  long local_240;
  undefined4 local_234;
  int *local_230;
  undefined4 local_224;
  int *local_220;
  undefined4 local_214;
  int *local_210;
  undefined4 local_204;
  int *local_200;
  undefined4 local_1f4;
  int *local_1f0;
  undefined4 local_1e4;
  int *local_1e0;
  undefined4 local_1d4;
  int *local_1d0;
  undefined4 local_1c4;
  int *local_1c0;
  undefined4 local_1b4;
  int *local_1b0;
  undefined4 local_1a4;
  int *local_1a0;
  undefined4 local_194;
  int *local_190;
  undefined4 local_184;
  int *local_180;
  IntVect *local_178;
  undefined1 *local_170;
  uint local_164;
  uint local_160;
  int local_15c;
  IntVect local_158;
  IntVect local_148;
  int local_138;
  uint local_134;
  Box *local_130;
  uint local_124;
  IntVect *local_120;
  uint local_114;
  uint local_110;
  int local_10c;
  int local_108 [3];
  undefined8 local_f8;
  int local_f0;
  uint local_ec;
  IntVect local_e8;
  IntVect local_d8;
  int local_c8;
  uint local_c4;
  Box *local_c0;
  uint local_b4;
  IntVect *local_b0;
  uint local_a4;
  undefined8 *local_a0;
  int local_98;
  undefined4 local_94;
  undefined8 *local_90;
  int local_88;
  undefined4 local_84;
  undefined8 *local_80;
  IntVect *local_78;
  undefined8 *local_70;
  int local_68;
  uint local_64;
  IntVect *local_60;
  int local_58;
  uint local_54;
  IntVect *local_50;
  int local_48;
  uint local_44;
  IntVect *local_40;
  int local_38;
  uint local_34;
  IntVect *local_30;
  uint local_24;
  uint *local_20;
  uint local_18;
  uint local_14;
  uint *local_10;
  uint local_4;
  
  local_288 = in_RSI;
  local_28c = ParallelDescriptor::MyProc();
  local_298 = boxArray(local_288);
  local_2a0 = DistributionMap(local_288);
  local_2a8 = IndexArray(local_288);
  LVar6 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x12a931f);
  local_2ac = (int)LVar6;
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0x12a9333);
  this_00 = (Box *)(in_RDI + 0x2c);
  iVar3 = Box::length(this_00,1);
  iVar3 = iVar3 / 2;
  piVar7 = (int *)(in_RDI + 0x20);
  local_184 = 0;
  local_138 = *piVar7;
  local_134 = 0;
  local_180 = piVar7;
  local_130 = this_00;
  pIVar8 = Box::smallEnd(this_00);
  local_148.vect[2] = pIVar8->vect[2];
  local_148.vect._0_8_ = *(undefined8 *)pIVar8->vect;
  pIVar8 = Box::bigEnd(local_130);
  iVar4 = pIVar8->vect[2];
  uVar1 = *(undefined8 *)pIVar8->vect;
  local_124 = local_134;
  local_15c = local_148.vect[(int)local_134];
  local_34 = local_134;
  local_148.vect[(int)local_134] = local_15c - local_138;
  local_44 = local_134;
  local_158.vect[(int)local_134] = local_15c + -1;
  local_158.vect._0_8_ = uVar1;
  local_158.vect[2] = iVar4;
  local_120 = &local_148;
  local_48 = local_15c + -1;
  local_40 = &local_158;
  local_38 = local_15c - local_138;
  local_30 = &local_148;
  local_164 = (uint)Box::ixType(local_130);
  local_10 = &local_160;
  local_14 = local_134;
  local_4 = local_134;
  local_164 = local_164 & ~(1 << (local_134 & 0x1f));
  local_160 = local_164;
  Box::Box((Box *)&stack0xfffffffffffffd18,&local_148,&local_158,(IndexType)local_164);
  local_194 = 0;
  local_c8 = *piVar7;
  local_c4 = 0;
  local_190 = piVar7;
  local_c0 = this_00;
  pIVar8 = Box::smallEnd(this_00);
  local_d8.vect[2] = pIVar8->vect[2];
  local_d8.vect._0_8_ = *(undefined8 *)pIVar8->vect;
  pIVar8 = Box::bigEnd(local_c0);
  local_e8.vect[2] = pIVar8->vect[2];
  local_e8.vect._0_8_ = *(undefined8 *)pIVar8->vect;
  IVar12 = Box::type((Box *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
  local_108[2] = IVar12.vect[2];
  local_f0 = local_108[2];
  local_108._0_8_ = IVar12.vect._0_8_;
  local_f8._0_4_ = local_108[0];
  local_f8._4_4_ = local_108[1];
  local_a4 = local_c4;
  local_ec = *(uint *)((long)&local_f8 + (long)(int)local_c4 * 4);
  local_b4 = local_c4;
  local_10c = (local_e8.vect[(int)local_c4] + 1) - (local_ec & 1);
  local_54 = local_c4;
  local_d8.vect[(int)local_c4] = local_10c;
  iVar4 = local_10c + -1 + local_c8;
  local_64 = local_c4;
  local_e8.vect[(int)local_c4] = iVar4;
  local_108 = IVar12.vect;
  local_b0 = &local_e8;
  local_a0 = &local_f8;
  local_68 = iVar4;
  local_60 = &local_e8;
  local_58 = local_10c;
  local_50 = &local_d8;
  local_114 = (uint)Box::ixType(local_c0);
  local_20 = &local_110;
  local_24 = local_c4;
  local_18 = local_c4;
  local_114 = local_114 & ~(1 << (local_c4 & 0x1f));
  local_110 = local_114;
  Box::Box((Box *)&stack0xfffffffffffffcfc,&local_d8,&local_e8,(IndexType)local_114);
  local_1a4 = 2;
  local_1a0 = piVar7;
  Box::grow((Box *)&stack0xfffffffffffffd18,2,*(int *)(in_RDI + 0x28));
  local_1b4 = 2;
  local_1b0 = piVar7;
  Box::grow((Box *)&stack0xfffffffffffffcfc,2,*(int *)(in_RDI + 0x28));
  local_1c4 = 0;
  local_1d4 = 1;
  local_1e4 = 2;
  local_1e0 = piVar7;
  local_1d0 = piVar7;
  local_1c0 = piVar7;
  IntVect::IntVect(&local_32c,-*piVar7,-*(int *)(in_RDI + 0x24),-*(int *)(in_RDI + 0x28));
  iVar4 = Box::bigEnd(this_00,2);
  local_1f4 = 2;
  local_1f0 = piVar7;
  IntVect::IntVect(&local_338,-1,-1,iVar4 + *(int *)(in_RDI + 0x28));
  Box::Box(&in_stack_fffffffffffff6f0->dbox,(IntVect *)in_stack_fffffffffffff6e8,
           (IntVect *)0x12a997f);
  pBVar9 = Box::setBig(&local_438,1,iVar3 + -1);
  local_418 = *(undefined8 *)(pBVar9->smallend).vect;
  uVar1 = *(undefined8 *)((pBVar9->smallend).vect + 2);
  uStack_404 = *(undefined8 *)((pBVar9->bigend).vect + 2);
  uStack_408 = (undefined4)((ulong)*(undefined8 *)(pBVar9->bigend).vect >> 0x20);
  uStack_410 = (undefined4)uVar1;
  local_40c = (undefined4)((ulong)uVar1 >> 0x20);
  pBVar9 = Box::setSmall(&local_458,1,iVar3);
  uStack_3fc = *(undefined8 *)(pBVar9->smallend).vect;
  uVar1 = *(undefined8 *)((pBVar9->smallend).vect + 2);
  uStack_3e8 = *(undefined8 *)((pBVar9->bigend).vect + 2);
  uStack_3ec = (undefined4)((ulong)*(undefined8 *)(pBVar9->bigend).vect >> 0x20);
  uStack_3f4 = (undefined4)uVar1;
  local_3f0 = (undefined4)((ulong)uVar1 >> 0x20);
  pBVar9 = Box::setBig(&local_478,1,iVar3 + -1);
  uStack_3e0 = *(undefined8 *)(pBVar9->smallend).vect;
  uVar1 = *(undefined8 *)((pBVar9->smallend).vect + 2);
  uStack_3cc = *(undefined8 *)((pBVar9->bigend).vect + 2);
  uStack_3d0 = (undefined4)((ulong)*(undefined8 *)(pBVar9->bigend).vect >> 0x20);
  uStack_3d8 = (undefined4)uVar1;
  local_3d4 = (undefined4)((ulong)uVar1 >> 0x20);
  pBVar9 = Box::setSmall(&local_498,1,iVar3);
  uStack_3c4 = *(undefined8 *)(pBVar9->smallend).vect;
  uVar1 = *(undefined8 *)((pBVar9->smallend).vect + 2);
  uStack_3b0 = *(undefined8 *)((pBVar9->bigend).vect + 2);
  uStack_3b4 = (undefined4)((ulong)*(undefined8 *)(pBVar9->bigend).vect >> 0x20);
  uStack_3bc = (undefined4)uVar1;
  local_3b8 = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_3a8 = local_320[0];
  local_88 = Box::length(this_00,1);
  local_204 = 1;
  local_88 = local_88 + *(int *)(in_RDI + 0x24);
  local_84 = 1;
  local_200 = piVar7;
  local_80 = local_320;
  Box::shift(&local_38c,1,local_88);
  pBVar9 = &local_370;
  local_98 = Box::length(this_00,0);
  local_214 = 0;
  local_98 = local_98 + *piVar7;
  local_94 = 0;
  local_210 = piVar7;
  local_90 = local_320;
  Box::shift(pBVar9,0,local_98);
  iVar4 = Box::length(this_00,0);
  local_224 = 0;
  iVar4 = iVar4 + *piVar7;
  local_220 = piVar7;
  iVar3 = Box::length(this_00,1);
  local_234 = 1;
  local_230 = piVar7;
  IntVect::IntVect(&local_4a4,iVar4,iVar3 + *(int *)(in_RDI + 0x24),0);
  local_78 = &local_4a4;
  local_70 = local_320;
  Box::shift(&local_354,&local_4a4);
  local_4ac = Box::length(this_00,0);
  local_4a8 = Box::length(this_00,1);
  local_4b4 = Box::length(this_00,0);
  local_4b0 = Box::length(this_00,1);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn::operator()((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn::operator()((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn::operator()((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn::operator()((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn2::operator()((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn2::operator()((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn2::operator()((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  std::array<amrex::Box,_8UL>::operator[]
            ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
             (size_type)in_stack_fffffffffffff6e8);
  NonLocalBC::PolarFn2::operator()((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
  local_5a0 = std::
              unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                           *)in_stack_fffffffffffff6f0);
  for (local_5b0 = 0; local_5b0 < local_2ac; local_5b0 = local_5b0 + 1) {
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6f0,
                        (size_type)in_stack_fffffffffffff6e8);
    local_5b4 = *piVar7;
    BoxArray::operator[]
              ((BoxArray *)in_stack_fffffffffffff700._M_current,
               (int)((ulong)in_stack_fffffffffffff6f8._M_current >> 0x20));
    in_stack_fffffffffffff734 = Box::smallEnd(&local_5d0,2);
    iVar3 = Box::smallEnd((Box *)(in_RDI + 0x2c),2);
    if (in_stack_fffffffffffff734 == iVar3) {
      local_240 = in_RDI + 0x20;
      local_244 = 2;
      Box::growLo(&local_5d0,2,*(int *)(in_RDI + 0x28));
    }
    in_stack_fffffffffffff730 = Box::bigEnd(&local_5d0,2);
    iVar3 = Box::bigEnd((Box *)(in_RDI + 0x2c),2);
    if (in_stack_fffffffffffff730 == iVar3) {
      local_250 = in_RDI + 0x20;
      local_254 = 2;
      Box::growHi(&local_5d0,2,*(int *)(in_RDI + 0x28));
    }
    for (local_5d4 = 0; local_5d4 < 8; local_5d4 = local_5d4 + 1) {
      std::array<amrex::Box,_8UL>::operator[]
                ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
                 (size_type)in_stack_fffffffffffff6e8);
      Box::operator&(&in_stack_fffffffffffff6f0->dbox,&in_stack_fffffffffffff6e8->dbox);
      bVar2 = Box::ok(&local_5f0);
      if (bVar2) {
        if (local_5d4 < 4) {
          NonLocalBC::PolarFn::operator()
                    ((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
        }
        else {
          NonLocalBC::PolarFn2::operator()
                    ((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
        }
        BoxArray::intersections
                  (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   SUB41((uint)in_stack_fffffffffffffd04 >> 0x18,0),
                   (IntVect *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_610 = 0;
        sVar10 = std::
                 vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                 size(&local_2c8);
        local_614 = (int)sVar10;
        for (; local_610 < local_614; local_610 = local_610 + 1) {
          pvVar11 = std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::operator[](&local_2c8,(long)local_610);
          local_618 = pvVar11->first;
          pvVar11 = std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::operator[](&local_2c8,(long)local_610);
          local_620 = &pvVar11->second;
          local_624 = DistributionMapping::operator[]
                                ((DistributionMapping *)in_stack_fffffffffffff6f0,
                                 (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20));
          if (local_624 != local_28c) {
            if (local_5d4 < 4) {
              NonLocalBC::PolarFn::operator()
                        ((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
            }
            else {
              NonLocalBC::PolarFn2::operator()
                        ((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
            }
            in_stack_fffffffffffff728 =
                 (Box *)std::
                        map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                        ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730
                                                ),(key_type *)in_stack_fffffffffffff728);
            in_stack_fffffffffffff720 = &local_680;
            CopyComTag::CopyComTag
                      (in_stack_fffffffffffff720,local_620,&local_640,local_618,local_5b4);
            std::
            vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
            ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                         *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
          }
        }
      }
    }
  }
  local_688 = std::
              unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                           *)in_stack_fffffffffffff6f0);
  for (local_68c = 0; local_68c < local_2ac; local_68c = local_68c + 1) {
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6f0,
                        (size_type)in_stack_fffffffffffff6e8);
    local_690 = *piVar7;
    BoxArray::operator[]
              ((BoxArray *)in_stack_fffffffffffff700._M_current,
               (int)((ulong)in_stack_fffffffffffff6f8._M_current >> 0x20));
    local_178 = (IntVect *)(in_RDI + 0x20);
    local_170 = local_6d0;
    Box::grow(&local_6b4,local_178);
    local_698 = &local_6b4;
    for (local_6d4 = 0; local_6d4 < 8; local_6d4 = local_6d4 + 1) {
      std::array<amrex::Box,_8UL>::operator[]
                ((array<amrex::Box,_8UL> *)in_stack_fffffffffffff6f0,
                 (size_type)in_stack_fffffffffffff6e8);
      Box::operator&(&in_stack_fffffffffffff6f0->dbox,&in_stack_fffffffffffff6e8->dbox);
      bVar2 = Box::ok(&local_6f0);
      if (bVar2) {
        if (local_6d4 < 4) {
          NonLocalBC::PolarFn::operator()
                    ((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
        }
        else {
          NonLocalBC::PolarFn2::operator()
                    ((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
        }
        BoxArray::intersections
                  ((BoxArray *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                   in_stack_fffffffffffff728,
                   (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    *)in_stack_fffffffffffff720);
        local_710 = 0;
        sVar10 = std::
                 vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                 size(&local_2c8);
        local_714 = (int)sVar10;
        for (; local_710 < local_714; local_710 = local_710 + 1) {
          pvVar11 = std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::operator[](&local_2c8,(long)local_710);
          local_718 = pvVar11->first;
          pvVar11 = std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::operator[](&local_2c8,(long)local_710);
          local_734.smallend.vect._0_8_ = *(undefined8 *)(pvVar11->second).smallend.vect;
          local_734._8_8_ = *(undefined8 *)((pvVar11->second).smallend.vect + 2);
          local_734.bigend.vect._4_8_ = *(undefined8 *)((pvVar11->second).bigend.vect + 1);
          local_734.btype.itype = (pvVar11->second).btype.itype;
          iVar3 = Box::smallEnd(&local_734,2);
          iVar5 = Box::smallEnd((Box *)(in_RDI + 0x2c),2);
          if (iVar3 == iVar5) {
            local_260 = in_RDI + 0x20;
            local_264 = 2;
            Box::growLo(&local_734,2,*(int *)(in_RDI + 0x28));
          }
          iVar3 = Box::bigEnd(&local_734,2);
          iVar5 = Box::bigEnd((Box *)(in_RDI + 0x2c),2);
          if (iVar3 == iVar5) {
            local_270 = in_RDI + 0x20;
            local_274 = 2;
            Box::growHi(&local_734,2,*(int *)(in_RDI + 0x28));
          }
          if (local_6d4 < 4) {
            NonLocalBC::PolarFn::operator()
                      ((PolarFn *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
          }
          else {
            NonLocalBC::PolarFn2::operator()
                      ((PolarFn2 *)CONCAT44(iVar4,in_stack_fffffffffffff790),pBVar9);
          }
          local_754 = DistributionMapping::operator[]
                                ((DistributionMapping *)in_stack_fffffffffffff6f0,
                                 (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20));
          CopyComTag::CopyComTag(&local_794,&local_750,&local_734,local_690,local_718);
          if (local_754 == local_28c) {
            std::
            unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
            ::operator->((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                          *)0x12aa7ac);
            std::
            vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
            ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                         *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8._M_current
                       );
          }
          else {
            in_stack_fffffffffffff700._M_current =
                 (CopyComTag *)
                 std::
                 map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                 ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                              (key_type *)in_stack_fffffffffffff728);
            std::
            vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
            ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                         *)in_stack_fffffffffffff700._M_current,in_stack_fffffffffffff6f8._M_current
                       );
          }
        }
      }
    }
  }
  for (local_798 = 0; local_798 < 2; local_798 = local_798 + 1) {
    if (local_798 == 0) {
      in_stack_fffffffffffff6f8._M_current =
           (CopyComTag *)
           std::
           unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                        *)in_stack_fffffffffffff6f0);
      in_stack_fffffffffffff6f0 = in_stack_fffffffffffff6f8._M_current;
    }
    else {
      in_stack_fffffffffffff6e8 =
           (value_type *)
           std::
           unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                        *)in_stack_fffffffffffff6f0);
      in_stack_fffffffffffff6f0 = in_stack_fffffffffffff6e8;
    }
    local_7a8 = in_stack_fffffffffffff6f0;
    local_7a0 = in_stack_fffffffffffff6f0;
    local_7b0._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
         ::begin((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                  *)in_stack_fffffffffffff6e8);
    local_7b8._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
         ::end((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                *)in_stack_fffffffffffff6e8);
    while (bVar2 = std::operator!=(&local_7b0,&local_7b8), bVar2) {
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                   *)0x12aa914);
      std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
      ::begin((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
               *)in_stack_fffffffffffff6e8);
      std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
      ::end((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
             *)in_stack_fffffffffffff6e8);
      std::
      sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>
                (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                    *)in_stack_fffffffffffff6f0);
    }
  }
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_stack_fffffffffffff700._M_current);
  return;
}

Assistant:

void
FabArrayBase::PolarB::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    const int ymid = m_domain.length(1) / 2;
    Box lox_box = amrex::adjCellLo(m_domain, 0, m_ngrow[0]);
    Box hix_box = amrex::adjCellHi(m_domain, 0, m_ngrow[0]);
#if (AMREX_SPACEDIM == 3)
    lox_box.grow(2, m_ngrow[2]);
    hix_box.grow(2, m_ngrow[2]);
#endif
    Box loxy_corner(IntVect{AMREX_D_DECL(-m_ngrow[0],-m_ngrow[1],-m_ngrow[2])},
                    IntVect{AMREX_D_DECL(-1,-1,m_domain.bigEnd(2)+m_ngrow[2])});
    Array<Box,8> const domain_dst{Box(lox_box).setBig  (1,ymid-1),
                                  Box(lox_box).setSmall(1,ymid  ),
                                  Box(hix_box).setBig  (1,ymid-1),
                                  Box(hix_box).setSmall(1,ymid  ),
                                  loxy_corner,
                                  amrex::shift(loxy_corner,1,m_domain.length(1)+m_ngrow[1]),
                                  amrex::shift(loxy_corner,0,m_domain.length(0)+m_ngrow[0]),
                                  amrex::shift(loxy_corner,
                                               IntVect{AMREX_D_DECL(m_domain.length(0)+m_ngrow[0],
                                                                    m_domain.length(1)+m_ngrow[1],
                                                                    0)})};

    auto const convert = NonLocalBC::PolarFn{m_domain.length(0), m_domain.length(1)};
    auto const convert_corner = NonLocalBC::PolarFn2{m_domain.length(0), m_domain.length(1)};

    Array<Box,8> const domain_src{convert(domain_dst[0]), convert(domain_dst[1]),
                                  convert(domain_dst[2]), convert(domain_dst[3]),
                                  convert_corner(domain_dst[4]), convert_corner(domain_dst[5]),
                                  convert_corner(domain_dst[6]), convert_corner(domain_dst[7])};

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
#if (AMREX_SPACEDIM == 3)
        if (gbx.smallEnd(2) == m_domain.smallEnd(2)) {
            gbx.growLo(2, m_ngrow[2]);
        }
        if (gbx.bigEnd(2) == m_domain.bigEnd(2)) {
            gbx.growHi(2, m_ngrow[2]);
        }
#endif

        for (int n = 0; n < 8; ++n) {
            Box const src_box = gbx & domain_src[n];
            if (src_box.ok()) {
                Box const dst_box = (n<4) ? convert(src_box) : convert_corner(src_box);
                ba.intersections(dst_box, isects, false, m_ngrow);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int krcv = isects[j].first;
                    const Box& bxrcv = isects[j].second;
                    const int dst_owner = dm[krcv];
                    if (dst_owner != myproc) // local copy will be dealt with later
                    {
                        Box const bxsnd = (n<4) ? convert(bxrcv) : convert_corner(bxrcv);
                        send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                                krcv, ksnd));
                    }
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        for (int n = 0; n < 8; ++n) {
            Box const dst_box = gbx & domain_dst[n];
            if (dst_box.ok()) {
                Box const src_box = (n<4) ? convert(dst_box) : convert_corner(dst_box);
                ba.intersections(src_box, isects);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int ksnd = isects[j].first;
                    Box bxsnd = isects[j].second;
                    // the ghosts at lo-x and hi-z boundary are the source too
#if (AMREX_SPACEDIM == 3)
                    if (bxsnd.smallEnd(2) == m_domain.smallEnd(2)) {
                        bxsnd.growLo(2, m_ngrow[2]);
                    }
                    if (bxsnd.bigEnd(2) == m_domain.bigEnd(2)) {
                        bxsnd.growHi(2, m_ngrow[2]);
                    }
#endif
                    const Box bxrcv = (n<4) ? convert(bxsnd) : convert_corner(bxsnd);
                    const int src_owner = dm[ksnd];
                    FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                    if (src_owner == myproc) {
                        m_LocTags->push_back(cct);
                    } else {
                        recv_tags[src_owner].push_back(cct);
                    }
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}